

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::Global> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
          (RefPtr<wabt::interp::Global> *__return_storage_ptr__,Store *this,Store *args,
          GlobalType *args_1,Value *args_2)

{
  Global *pGVar1;
  Index index;
  GlobalType local_58;
  Global *local_40;
  Ref local_38;
  Ref ref;
  Value *args_local_2;
  GlobalType *args_local_1;
  Store *args_local;
  Store *this_local;
  RefPtr<wabt::interp::Global> *ptr;
  
  ref.index = (size_t)args_2;
  pGVar1 = (Global *)operator_new(0x70);
  GlobalType::GlobalType(&local_58,args_1);
  Global::Global(pGVar1,args,&local_58,*(Value *)ref.index);
  local_40 = pGVar1;
  index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
          ::New<wabt::interp::Global*>
                    ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                      *)&this->objects_,&local_40);
  Ref::Ref(&local_38,index);
  GlobalType::~GlobalType(&local_58);
  RefPtr<wabt::interp::Global>::RefPtr(__return_storage_ptr__,this,local_38);
  pGVar1 = RefPtr<wabt::interp::Global>::operator->(__return_storage_ptr__);
  (pGVar1->super_Extern).super_Object.self_.index = local_38.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}